

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

iterator __thiscall
pstore::romfs::directory::find(directory *this,not_null<const_char_*> name,size_t length)

{
  size_t sVar1;
  char *__s1;
  int iVar2;
  pointer pvVar3;
  pointer pvVar4;
  difference_type __d;
  size_t sVar5;
  ulong uVar6;
  
  sVar1 = this->size_;
  pvVar3 = (this->members_).ptr_;
  pvVar4 = pvVar3;
  sVar5 = sVar1;
  while (uVar6 = sVar5, 0 < (long)uVar6) {
    sVar5 = uVar6 >> 1;
    iVar2 = strncmp(pvVar4[sVar5].name_.ptr_,name.ptr_,length);
    if (iVar2 < 0) {
      pvVar4 = pvVar4 + sVar5 + 1;
      sVar5 = ~sVar5 + uVar6;
    }
  }
  pvVar3 = pvVar3 + sVar1;
  if (pvVar4 != pvVar3) {
    __s1 = (pvVar4->name_).ptr_;
    iVar2 = strncmp(__s1,name.ptr_,length);
    if ((iVar2 == 0) && (__s1[length] == '\0')) {
      return (iterator)pvVar4;
    }
  }
  return (iterator)pvVar3;
}

Assistant:

auto directory::find (gsl::not_null<char const *> const name, std::size_t length) const
            -> iterator {

            // Directories are sorted by name: we can use a binary search here.
            auto const end = this->end ();
            auto const it = std::lower_bound (
                this->begin (), end, std::make_pair (name, length),
                [] (dirent const & a,
                    std::pair<gsl::not_null<char const *>, std::size_t> const & b) {
                    return std::strncmp (a.name (), b.first, b.second) < 0;
                });
            if (it != end) {
                gsl::czstring const n = it->name ();
                if (std::strncmp (n, name, length) == 0 && n[length] == '\0') {
                    return it;
                }
            }
            return end;
        }